

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileExpr(jx9_gen_state *pGen,sxi32 iFlags,
                    _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *xTreeValidator)

{
  int iVar1;
  jx9_vm *pjVar2;
  SyToken *pSVar3;
  bool bVar4;
  byte bVar5;
  void *pvVar6;
  int iVar7;
  sxi32 sVar8;
  uint uVar9;
  SyToken *pCur_3;
  undefined8 *pChunk;
  code *pcVar10;
  SyToken *pSVar11;
  jx9_expr_op *pjVar12;
  ulong uVar13;
  jx9_expr_node *pjVar14;
  char *pcVar15;
  sxu32 sVar16;
  long lVar17;
  SyToken *pSVar18;
  sxi32 *psVar19;
  SyToken *pSVar20;
  int iVar21;
  int iVar22;
  SyToken *pSVar23;
  uint uVar24;
  jx9_expr_node *unaff_R13;
  SyToken *pCur;
  ulong uVar25;
  jx9_expr_node *pjVar26;
  SySet sExprNode;
  jx9_expr_node *pNode;
  SyToken *pTmp;
  SySet local_78;
  sxi32 local_4c;
  undefined8 *local_48;
  _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *local_40;
  SyToken *local_38;
  
  local_78.pAllocator = &pGen->pVm->sAllocator;
  local_78.nSize = 0;
  local_78.eSize = 8;
  local_78.nUsed = 0;
  local_78.nCursor = 0;
  local_78.pBase = (void *)0x0;
  local_78.pUserData = (void *)0x0;
  local_78.pBase = SyMemBackendAlloc(local_78.pAllocator,0x80);
  if ((jx9_expr_node **)local_78.pBase != (jx9_expr_node **)0x0) {
    local_78.nSize = 0x10;
  }
  pSVar18 = pGen->pIn;
  pSVar11 = pGen->pEnd;
  pSVar23 = pSVar18;
  if (pSVar18 < pSVar11) {
    iVar7 = 0;
    do {
      uVar24 = pSVar23->nType;
      if ((uVar24 & 0x40) == 0) {
        if ((char)uVar24 < '\0') {
          iVar7 = iVar7 + -1;
        }
        else if (((uVar24 >> 0x12 & 1) != 0) && (iVar7 < 1)) break;
      }
      else {
        iVar7 = iVar7 + 1;
      }
      pSVar23 = pSVar23 + 1;
    } while (pSVar23 < pSVar11);
  }
  bVar5 = 0;
  if (pSVar23 <= pSVar18) goto LAB_00125edb;
  pGen->pEnd = pSVar23;
  pjVar26 = (jx9_expr_node *)0x0;
  local_78.nUsed = 0;
  local_78.nCursor = 0;
  local_48 = (undefined8 *)0x0;
  local_4c = iFlags;
  local_40 = xTreeValidator;
  local_38 = pSVar11;
  do {
    pChunk = (undefined8 *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0x68);
    if (pChunk == (undefined8 *)0x0) {
      unaff_R13 = (jx9_expr_node *)0xffffffff;
    }
    else {
      pChunk[10] = 0;
      pChunk[0xb] = 0;
      pChunk[8] = 0;
      pChunk[9] = 0;
      pChunk[6] = 0;
      pChunk[7] = 0;
      pChunk[4] = 0;
      pChunk[5] = 0;
      pChunk[2] = 0;
      pChunk[3] = 0;
      *pChunk = 0;
      pChunk[1] = 0;
      pChunk[0xc] = 0;
      pjVar2 = pGen->pVm;
      *(undefined8 *)((long)pChunk + 0x4c) = 0x800000000;
      *(undefined4 *)(pChunk + 9) = 0;
      *(undefined4 *)((long)pChunk + 0x54) = 0;
      pChunk[7] = pjVar2;
      pChunk[8] = 0;
      pChunk[0xb] = 0;
      pSVar18 = pGen->pIn;
      pChunk[3] = pSVar18;
      uVar24 = pSVar18->nType;
      if ((uVar24 & 0x20) != 0) {
        *pChunk = pSVar18->pUserData;
        goto LAB_00125837;
      }
      if ((uVar24 & 0x10) == 0) {
        if ((uVar24 & 0x40) == 0) {
          if ((uVar24 >> 0xb & 1) == 0) {
            if ((uVar24 & 4) == 0) {
              if ((uVar24 & 8) != 0) {
                pSVar11 = pSVar18 + 1;
                pcVar10 = jx9CompileLiteral;
                goto LAB_00125855;
              }
              if ((uVar24 & 0x121680) == 0) {
                pjVar14 = (jx9_expr_node *)jx9CompileNumLiteral;
                if (((((uVar24 & 3) == 0) &&
                     (pjVar14 = (jx9_expr_node *)jx9CompileString, (uVar24 >> 0xd & 1) == 0)) &&
                    (pjVar14 = (jx9_expr_node *)jx9CompileSimpleString, (uVar24 >> 0xe & 1) == 0))
                   && (pjVar14 = (jx9_expr_node *)jx9CompileNowdoc, (uVar24 >> 0x10 & 1) == 0)) {
                  pjVar14 = pjVar26;
                }
                pChunk[6] = pjVar14;
                if (pjVar14 == (jx9_expr_node *)0x0) {
                  iVar7 = jx9GenCompileError(pGen,1,pSVar18->nLine,
                                             "Syntax error: Unexpected token \'%z\'",pSVar18);
                  goto LAB_001259bb;
                }
              }
LAB_00125837:
              pSVar11 = pSVar18 + 1;
              goto LAB_0012585c;
            }
            iVar7 = *(int *)&pSVar18->pUserData;
            pSVar11 = pSVar18;
            if ((iVar7 - 0xdU < 4) || (iVar7 == 2)) {
              pSVar3 = pGen->pEnd;
              if (pSVar3 <= pSVar18 + 1) goto LAB_00125a93;
              if (pSVar18 < pSVar3) {
                iVar7 = 1;
                do {
                  if ((pSVar11->nType & 0xa40) == 0) {
                    if ((pSVar11->nType & 0x1480) != 0) {
                      if (iVar7 < 2) break;
                      iVar7 = iVar7 + -1;
                    }
                  }
                  else {
                    iVar7 = iVar7 + 1;
                  }
                  pSVar11 = pSVar11 + 1;
                } while (pSVar11 < pSVar3);
              }
              pcVar10 = jx9CompileLangConstruct;
LAB_00125a9e:
              pChunk[6] = pcVar10;
              bVar4 = true;
            }
            else {
              if (iVar7 != 6) {
LAB_00125a93:
                pSVar11 = pSVar18 + 1;
                pcVar10 = jx9CompileLiteral;
                goto LAB_00125a9e;
              }
              pSVar11 = pSVar18 + 1;
              pSVar3 = pGen->pEnd;
              if (pSVar11 < pSVar3) {
                pSVar20 = pSVar18 + 2;
                if ((pSVar18[1].nType & 0xc) == 0) {
                  pSVar20 = pSVar11;
                }
                if ((pSVar20 < pSVar3) && ((pSVar20->nType & 0x200) != 0)) {
                  pSVar11 = pSVar20 + 1;
                  if (pSVar11 < pSVar3) {
                    iVar7 = 1;
                    do {
                      if ((pSVar11->nType >> 9 & 1) == 0) {
                        if ((pSVar11->nType >> 10 & 1) != 0) {
                          if (iVar7 < 2) break;
                          iVar7 = iVar7 + -1;
                        }
                      }
                      else {
                        iVar7 = iVar7 + 1;
                      }
                      pSVar11 = pSVar11 + 1;
                    } while (pSVar11 < pSVar3);
                  }
                  if ((pSVar3 <= pSVar11) || (pSVar3 <= pSVar11 + 1)) {
                    pcVar15 = "Syntax error while declaring annonymous function";
                    goto LAB_00125a64;
                  }
                  if ((pSVar11[1].nType & 0x40) == 0) {
                    uVar24 = jx9GenCompileError(pGen,1,pSVar18->nLine,
                                                "Syntax error while declaring annonymous function, missing \'{\'"
                                               );
                    pSVar11 = pSVar11 + 1;
                    if (uVar24 == 0xfffffff6) {
                      pSVar11 = pSVar18;
                    }
                    unaff_R13 = (jx9_expr_node *)(ulong)uVar24;
                    if (uVar24 != 0xfffffff6) {
                      unaff_R13 = pjVar26;
                    }
                  }
                  else {
                    pSVar11 = pSVar11 + 2;
                    if (pSVar11 < pSVar3) {
                      iVar7 = 1;
                      do {
                        if ((pSVar11->nType & 0x40) == 0) {
                          if ((char)pSVar11->nType < '\0') {
                            if (iVar7 < 2) break;
                            iVar7 = iVar7 + -1;
                          }
                        }
                        else {
                          iVar7 = iVar7 + 1;
                        }
                        pSVar11 = pSVar11 + 1;
                      } while (pSVar11 < pSVar3);
                    }
                    pSVar11 = pSVar11 + (pSVar11 < pSVar3);
                    unaff_R13 = (jx9_expr_node *)0x0;
                  }
                }
                else {
                  pcVar15 = "Missing opening parenthesis \'(\' while declaring annonymous function";
                  pSVar11 = pSVar20;
LAB_00125a64:
                  sVar8 = jx9GenCompileError(pGen,1,pSVar18->nLine,pcVar15);
                  unaff_R13 = (jx9_expr_node *)(ulong)((uint)(sVar8 == -10) * 2 | 0xfffffff4);
                }
                if ((int)unaff_R13 == 0) {
                  pcVar10 = jx9CompileAnnonFunc;
                  goto LAB_00125a9e;
                }
                SyMemBackendPoolFree(&pGen->pVm->sAllocator,pChunk);
                bVar4 = false;
              }
              else {
                pChunk[6] = jx9CompileLiteral;
                bVar4 = true;
              }
            }
            if (!bVar4) goto LAB_001259d7;
            goto LAB_0012585c;
          }
          pSVar11 = pSVar18 + 1;
          pSVar3 = pGen->pEnd;
          if (pSVar11 < pSVar3) {
            iVar7 = 1;
            do {
              if ((pSVar11->nType >> 0xb & 1) == 0) {
                if ((pSVar11->nType >> 0xc & 1) != 0) {
                  if (iVar7 < 2) break;
                  iVar7 = iVar7 + -1;
                }
              }
              else {
                iVar7 = iVar7 + 1;
              }
              pSVar11 = pSVar11 + 1;
            } while (pSVar11 < pSVar3);
          }
          if (pSVar3 <= pSVar11) {
            sVar16 = pSVar18->nLine;
            pcVar15 = "JSON Array: Missing closing square bracket \']\'";
            goto LAB_001259b4;
          }
          pcVar10 = jx9CompileJsonArray;
        }
        else {
          pSVar11 = pSVar18 + 1;
          pSVar3 = pGen->pEnd;
          if (pSVar11 < pSVar3) {
            iVar7 = 1;
            do {
              if ((pSVar11->nType & 0x40) == 0) {
                if ((char)pSVar11->nType < '\0') {
                  if (iVar7 < 2) break;
                  iVar7 = iVar7 + -1;
                }
              }
              else {
                iVar7 = iVar7 + 1;
              }
              pSVar11 = pSVar11 + 1;
            } while (pSVar11 < pSVar3);
          }
          if (pSVar3 <= pSVar11) {
            sVar16 = pSVar18->nLine;
            pcVar15 = "JSON Object: Missing closing braces \'}\'";
            goto LAB_001259b4;
          }
          pcVar10 = jx9CompileJsonObject;
        }
        pSVar11 = pSVar11 + 1;
        pChunk[6] = pcVar10;
      }
      else {
        if (pGen->pEnd <= pSVar18 + 1) {
          sVar16 = pSVar18->nLine;
          pcVar15 = "Invalid variable name";
LAB_001259b4:
          iVar7 = jx9GenCompileError(pGen,1,sVar16,pcVar15);
LAB_001259bb:
          unaff_R13 = (jx9_expr_node *)(ulong)((uint)(iVar7 == -10) * 2 | 0xfffffff4);
          SyMemBackendPoolFree(&pGen->pVm->sAllocator,pChunk);
          goto LAB_001259d7;
        }
        pSVar11 = pSVar18 + 2;
        pcVar10 = jx9CompileVariable;
LAB_00125855:
        pChunk[6] = pcVar10;
      }
LAB_0012585c:
      pChunk[4] = pSVar11;
      pGen->pIn = pSVar11;
      unaff_R13 = (jx9_expr_node *)0x0;
      local_48 = pChunk;
    }
LAB_001259d7:
    uVar24 = (uint)unaff_R13;
    if ((uint)unaff_R13 != 0) goto LAB_00125e11;
    SySetPut(&local_78,&local_48);
    sVar16 = local_78.nUsed;
    pvVar6 = local_78.pBase;
  } while (pGen->pIn < pGen->pEnd);
  uVar25 = (ulong)local_78.nUsed;
  if (uVar25 == 0) {
    pjVar26 = (jx9_expr_node *)0x0;
    uVar24 = 0;
  }
  else {
    if ((int)local_78.nUsed < 1) {
LAB_00125da6:
      uVar24 = 0;
    }
    else {
      pjVar26 = *local_78.pBase;
      if ((pjVar26->pOp != (jx9_expr_op *)0x0) && ((pjVar26->pOp->iOp & 0xfffffffeU) == 0x10)) {
        pjVar12 = jx9ExprExtractOperator(&pjVar26->pStart->sData,(SyToken *)0x0);
        pjVar26->pOp = pjVar12;
        (*pvVar6)->pStart->pUserData = (*pvVar6)->pOp;
      }
      uVar13 = 0;
      iVar21 = 0;
      iVar7 = 0;
      iVar22 = 0;
      do {
        pjVar26 = *(jx9_expr_node **)((long)pvVar6 + uVar13 * 8);
        pSVar18 = pjVar26->pStart;
        uVar24 = pSVar18->nType;
        if ((uVar24 >> 9 & 1) == 0) {
          if ((uVar24 >> 10 & 1) == 0) {
            if (((uVar24 >> 0xb & 1) == 0) || (pjVar26->xCode != (ProcNodeConstruct)0x0)) {
              if ((uVar24 >> 0xc & 1) == 0) {
                if (((uVar24 & 0x40) == 0) || (pjVar26->xCode != (ProcNodeConstruct)0x0)) {
                  if ((char)uVar24 < '\0') {
                    if (iVar21 < 1) {
                      pcVar15 = "Syntax error: Unexpected token \'}\'";
                      goto LAB_00125dc4;
                    }
                    iVar21 = iVar21 + -1;
                  }
                  else if ((((uVar13 != 0) && ((uVar24 & 0x20) != 0)) &&
                           (iVar1 = pjVar26->pOp->iOp, iVar1 - 7U < 2)) &&
                          ((*(jx9_expr_node **)((long)pvVar6 + (uVar13 - 1) * 8))->xCode ==
                           jx9CompileVariable ||
                           (*(jx9_expr_node **)((long)pvVar6 + (uVar13 - 1) * 8))->xCode ==
                           jx9CompileLiteral)) {
                    psVar19 = &aOpTable[0].iOp;
                    lVar17 = 0;
                    do {
                      if (*psVar19 == (iVar1 == 8 ^ 0x11)) goto LAB_00125cdf;
                      lVar17 = lVar17 + 1;
                      psVar19 = psVar19 + 8;
                    } while (lVar17 != 0x32);
                    lVar17 = 0x32;
LAB_00125cdf:
                    pjVar26->pOp = aOpTable + lVar17;
                    (*(jx9_expr_node **)((long)pvVar6 + uVar13 * 8))->pStart->pUserData =
                         aOpTable + lVar17;
                  }
                }
                else {
                  iVar21 = iVar21 + 1;
                }
              }
              else {
                if (iVar7 < 1) {
                  pcVar15 = "Syntax error: Unexpected token \']\'";
                  goto LAB_00125dc4;
                }
                iVar7 = iVar7 + -1;
              }
            }
            else {
              iVar7 = iVar7 + 1;
            }
          }
          else {
            if (iVar22 < 1) {
              pcVar15 = "Syntax error: Unexpected token \')\'";
              goto LAB_00125dc4;
            }
            iVar22 = iVar22 + -1;
          }
        }
        else {
          if ((uVar13 != 0) &&
             (((pjVar26 = *(jx9_expr_node **)((long)pvVar6 + (uVar13 - 1) * 8),
               pjVar26->xCode == jx9CompileLiteral || pjVar26->xCode == jx9CompileVariable ||
               ((pjVar26->pStart->nType & 0x740c) != 0)) && ((pjVar26->pStart->nType & 0x20) == 0)))
             ) {
            pSVar18->nType = uVar24 | 0x20;
            pSVar18->pUserData = &sFCallOp;
            (*(jx9_expr_node **)((long)pvVar6 + uVar13 * 8))->pOp = &sFCallOp;
          }
          iVar22 = iVar22 + 1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar25);
      if ((iVar22 == 0 && iVar7 == 0) && iVar21 == 0) goto LAB_00125da6;
      pSVar18 = (*pvVar6)->pStart;
      pcVar15 = "Syntax error, mismatched \'(\', \'[\' or \'{\'";
LAB_00125dc4:
      sVar8 = jx9GenCompileError(pGen,1,pSVar18->nLine,pcVar15);
      uVar24 = (uint)(sVar8 == -10) * 2 | 0xfffffff4;
    }
    if (uVar24 == 0) {
      uVar9 = ExprMakeTree(pGen,(jx9_expr_node **)pvVar6,sVar16);
      uVar24 = 0;
      if (uVar9 == 0) {
        pjVar26 = *pvVar6;
      }
      else {
        pjVar26 = (jx9_expr_node *)0x0;
        uVar24 = uVar9;
      }
    }
    else {
      pjVar26 = (jx9_expr_node *)0x0;
    }
  }
LAB_00125e11:
  bVar5 = 0;
  if ((uVar24 == 0) && (pjVar26 != (jx9_expr_node *)0x0)) {
    if ((local_40 == (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0) ||
       (sVar8 = (*local_40)(pGen,pjVar26), sVar8 != -10)) {
      uVar24 = GenStateEmitExprCode(pGen,pjVar26,local_4c);
    }
    else {
      uVar24 = 0xfffffff6;
    }
    bVar5 = 1;
  }
  pvVar6 = local_78.pBase;
  uVar25 = (ulong)local_78.nUsed;
  if (uVar25 != 0) {
    uVar13 = 0;
    do {
      if (*(jx9_expr_node **)((long)pvVar6 + uVar13 * 8) != (jx9_expr_node *)0x0) {
        ExprFreeTree(pGen,*(jx9_expr_node **)((long)pvVar6 + uVar13 * 8));
      }
      uVar13 = uVar13 + 1;
    } while (uVar25 != uVar13);
  }
  pGen->pEnd = local_38;
  pGen->pIn = pSVar23;
  if (uVar24 == 0xfffffff6) {
    if ((jx9_expr_node **)pvVar6 != (jx9_expr_node **)0x0 &&
        (jx9_vm *)local_78.pAllocator != (jx9_vm *)0x0) {
      SyMemBackendFree(local_78.pAllocator,pvVar6);
    }
    return -10;
  }
LAB_00125edb:
  if (((jx9_vm *)local_78.pAllocator != (jx9_vm *)0x0) &&
     ((jx9_expr_node **)local_78.pBase != (jx9_expr_node **)0x0)) {
    SyMemBackendFree(local_78.pAllocator,local_78.pBase);
  }
  return (uint)bVar5 * 3 + -3;
}

Assistant:

static sxi32 jx9CompileExpr(
	jx9_gen_state *pGen, /* Code generator state */
	sxi32 iFlags,        /* Control flags */
	sxi32 (*xTreeValidator)(jx9_gen_state *, jx9_expr_node *) /* Node validator callback.NULL otherwise */
	)
{
	jx9_expr_node *pRoot;
	SySet sExprNode;
	SyToken *pEnd;
	sxi32 nExpr;
	sxi32 iNest;
	sxi32 rc;
	/* Initialize worker variables */
	nExpr = 0;
	pRoot = 0;
	SySetInit(&sExprNode, &pGen->pVm->sAllocator, sizeof(jx9_expr_node *));
	SySetAlloc(&sExprNode, 0x10);
	rc = SXRET_OK;
	/* Delimit the expression */
	pEnd = pGen->pIn;
	iNest = 0;
	while( pEnd < pGen->pEnd ){
		if( pEnd->nType & JX9_TK_OCB /* '{' */ ){
			/* Ticket 1433-30: Annonymous/Closure functions body */
			iNest++;
		}else if(pEnd->nType & JX9_TK_CCB /* '}' */ ){
			iNest--;
		}else if( pEnd->nType & JX9_TK_SEMI /* ';' */ ){
			if( iNest <= 0 ){
				break;
			}
		}
		pEnd++;
	}
	if( iFlags & EXPR_FLAG_COMMA_STATEMENT ){
		SyToken *pEnd2 = pGen->pIn;
		iNest = 0;
		/* Stop at the first comma */
		while( pEnd2 < pEnd ){
			if( pEnd2->nType & (JX9_TK_OCB/*'{'*/|JX9_TK_OSB/*'['*/|JX9_TK_LPAREN/*'('*/) ){
				iNest++;
			}else if(pEnd2->nType & (JX9_TK_CCB/*'}'*/|JX9_TK_CSB/*']'*/|JX9_TK_RPAREN/*')'*/)){
				iNest--;
			}else if( pEnd2->nType & JX9_TK_COMMA /*','*/ ){
				if( iNest <= 0 ){
					break;
				}
			}
			pEnd2++;
		}
		if( pEnd2 <pEnd ){
			pEnd = pEnd2;
		}
	}
	if( pEnd > pGen->pIn ){
		SyToken *pTmp = pGen->pEnd;
		/* Swap delimiter */
		pGen->pEnd = pEnd;
		/* Try to get an expression tree */
		rc = jx9ExprMakeTree(&(*pGen), &sExprNode, &pRoot);
		if( rc == SXRET_OK && pRoot ){
			rc = SXRET_OK;
			if( xTreeValidator ){
				/* Call the upper layer validator callback */
				rc = xTreeValidator(&(*pGen), pRoot);
			}
			if( rc != SXERR_ABORT ){
				/* Generate code for the given tree */
				rc = GenStateEmitExprCode(&(*pGen), pRoot, iFlags);
			}
			nExpr = 1;
		}
		/* Release the whole tree */
		jx9ExprFreeTree(&(*pGen), &sExprNode);
		/* Synchronize token stream */
		pGen->pEnd = pTmp;
		pGen->pIn  = pEnd;
		if( rc == SXERR_ABORT ){
			SySetRelease(&sExprNode);
			return SXERR_ABORT;
		}
	}
	SySetRelease(&sExprNode);
	return nExpr > 0 ? SXRET_OK : SXERR_EMPTY;
}